

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

void ipred_ipf_core_s16(pel *src,pel *dst,int i_dst,s16 *pred,int flt_range_hor,int flt_range_ver,
                       s8 *flt_hor_coef,s8 *flt_ver_coef,int w,int h,int bit_depth)

{
  int iVar1;
  pel pVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = ~(-1 << ((byte)bit_depth & 0x1f));
  if (flt_range_ver < 1) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      iVar1 = (int)flt_ver_coef[uVar7];
      uVar5 = 0;
      if (0 < flt_range_hor) {
        uVar5 = 0;
        do {
          uVar4 = (int)((uint)src[uVar5 + 1] * iVar1 + (uint)src[~uVar7] * (int)flt_hor_coef[uVar5]
                        + (int)pred[uVar5] * ((0x40 - iVar1) - (int)flt_hor_coef[uVar5]) + 0x20) >>
                  6;
          uVar3 = uVar4;
          if ((int)uVar6 <= (int)uVar4) {
            uVar3 = uVar6;
          }
          pVar2 = (pel)uVar3;
          if ((int)uVar4 < 0) {
            pVar2 = '\0';
          }
          dst[uVar5] = pVar2;
          uVar5 = uVar5 + 1;
        } while ((uint)flt_range_hor != uVar5);
      }
      if ((int)uVar5 < w) {
        uVar5 = uVar5 & 0xffffffff;
        do {
          uVar4 = (int)((uint)src[uVar5 + 1] * iVar1 + (int)pred[uVar5] * (0x40 - iVar1) + 0x20) >>
                  6;
          uVar3 = uVar6;
          if ((int)uVar4 < (int)uVar6) {
            uVar3 = uVar4;
          }
          pVar2 = (pel)uVar3;
          if ((int)uVar4 < 0) {
            pVar2 = '\0';
          }
          dst[uVar5] = pVar2;
          uVar5 = uVar5 + 1;
        } while ((uint)w != uVar5);
      }
      dst = dst + i_dst;
      pred = pred + w;
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)flt_range_ver);
  }
  if ((int)uVar7 < h) {
    uVar7 = uVar7 & 0xffffffff;
    do {
      if (0 < w) {
        uVar5 = 0;
        do {
          iVar1 = 0;
          if ((long)uVar5 < (long)flt_range_hor) {
            iVar1 = (int)flt_hor_coef[uVar5];
          }
          uVar4 = (int)((uint)src[(int)~(uint)uVar7] * iVar1 + (int)pred[uVar5] * (0x40 - iVar1) +
                       0x20) >> 6;
          uVar3 = uVar4;
          if ((int)uVar6 <= (int)uVar4) {
            uVar3 = uVar6;
          }
          pVar2 = (pel)uVar3;
          if ((int)uVar4 < 0) {
            pVar2 = '\0';
          }
          dst[uVar5] = pVar2;
          uVar5 = uVar5 + 1;
        } while ((uint)w != uVar5);
      }
      dst = dst + i_dst;
      uVar7 = uVar7 + 1;
      pred = pred + w;
    } while (uVar7 != (uint)h);
  }
  return;
}

Assistant:

void ipred_ipf_core_s16(pel *src, pel *dst, int i_dst, s16 *pred, int flt_range_hor, int flt_range_ver, const s8 *flt_hor_coef, const s8 *flt_ver_coef, int w, int h, int bit_depth)
{
    pel *p_top = src + 1;
    int max_val = (1 << bit_depth) - 1;
    int row;

    for (row = 0; row < flt_range_ver; ++row) {
        s32 coeff_top = flt_ver_coef[row];
        int col;

        for (col = 0; col < flt_range_hor; col++) {
            s32 coeff_left = flt_hor_coef[col];
            s32 coeff_cur = 64 - coeff_left - coeff_top;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_top * p_top[col] + coeff_cur * pred[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        for (; col < w; col++) {
            s32 coeff_cur = 64 - coeff_top;
            s32 sample_val = (coeff_top * p_top[col] + coeff_cur * pred[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
        pred += w;
    }
    for (; row < h; ++row) {
        for (s32 col = 0; col < w; col++) {
            s32 coeff_left = (col < flt_range_hor) ? flt_hor_coef[col] : 0;
            s32 coeff_cur = 64 - coeff_left;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_cur * pred[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
        pred += w;
    }
}